

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckTypeStackEnd(TypeChecker *this,char *desc)

{
  Result RVar1;
  Label *label;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  
  RVar1 = TopLabel(this,&label);
  if (RVar1.enum_ == Error) {
    RVar1.enum_ = Error;
  }
  else {
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar1.enum_._1_3_ = 0;
    RVar1.enum_._0_1_ =
         (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3 != label->type_stack_limit;
    PrintStackIfFailedV(this,RVar1,desc,(TypeVector *)&local_38,true);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_38);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckTypeStackEnd(const char* desc) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  Result result = (type_stack_.size() == label->type_stack_limit)
                      ? Result::Ok
                      : Result::Error;
  PrintStackIfFailedV(result, desc, {}, /*is_end=*/true);
  return result;
}